

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.h
# Opt level: O2

void __thiscall Plane::Plane(Plane *this,Vector3f *norm,float d,Material *m)

{
  Vector3f *this_00;
  int iVar1;
  
  (this->super_Object).remit = 0;
  this_00 = &this->norm;
  (this->super_Object).m = m;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_intersect_00216a48;
  Vector3f::Vector3f(this_00,norm);
  this->d = d;
  Vector3f::Vector3f(&this->o,0.0);
  Matrix3f::Matrix3f(&this->matrix,0.0);
  Vector3f::length(this_00);
  Vector3f::normalize(this_00);
  iVar1 = (*m->_vptr_Material[2])(m);
  if ((char)iVar1 != '\0') {
    prepare_coords(this);
    return;
  }
  return;
}

Assistant:

Plane(const Vector3f& norm, float d, Material*m):
		norm(norm),d(d),Object(m) {
		d /= this->norm.length();
		this->norm.normalize();
		if (m->need_coords()) prepare_coords();
	}